

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cc
# Opt level: O2

bool flow::lang::TokenTraits::isKeyword(Token t)

{
  return t - Var < 0xd;
}

Assistant:

bool TokenTraits::isKeyword(Token t) {
  switch (t) {
    case Token::Var:
    case Token::On:
    case Token::While:
    case Token::For:
    case Token::Do:
    case Token::If:
    case Token::Match:
    case Token::Then:
    case Token::Else:
    case Token::Unless:
    case Token::Import:
    case Token::From:
    case Token::Handler:
      return true;
    default:
      return false;
  }
}